

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

CloudNode * Cloud_bddXor(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  byte bVar1;
  CloudCacheEntry2 *pCVar2;
  CloudNode *pCVar3;
  CloudNode *pCVar4;
  CloudNode *pCVar5;
  
  if (((CloudNode *)0x1 < f) && ((CloudNode *)0x1 < g)) {
    pCVar3 = dd->tUnique;
    if ((f < pCVar3) || (pCVar3 + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21d,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < pCVar3) || (pCVar3 + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21e,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      bVar1 = (byte)dd->bitsCache[0];
      pCVar2 = (CloudCacheEntry2 *)calloc((long)(1 << (bVar1 & 0x1f)),0x20);
      dd->tCaches[0] = pCVar2;
      dd->nMemUsed = dd->nMemUsed + (0x20 << (bVar1 & 0x1f));
    }
    pCVar5 = (CloudNode *)((ulong)g ^ 1);
    pCVar3 = pCVar5;
    pCVar4 = f;
    if (pCVar5 < f) {
      pCVar3 = f;
      pCVar4 = pCVar5;
    }
    pCVar3 = cloudBddAnd(dd,pCVar4,pCVar3);
    if (pCVar3 != (CloudNode *)0x0) {
      pCVar5 = (CloudNode *)((ulong)f ^ 1);
      pCVar4 = g;
      if (g < pCVar5) {
        pCVar4 = pCVar5;
        pCVar5 = g;
      }
      pCVar4 = cloudBddAnd(dd,pCVar5,pCVar4);
      if (pCVar4 != (CloudNode *)0x0) {
        pCVar3 = Cloud_bddOr(dd,pCVar3,pCVar4);
        return pCVar3;
      }
    }
  }
  return (CloudNode *)0x0;
}

Assistant:

CloudNode * Cloud_bddXor( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * t0, * t1, * r;
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    t0 = cloudBddAnd_gate( dd, f, Cloud_Not(g) );
    if ( t0 == NULL )
        return NULL;
    t1 = cloudBddAnd_gate( dd, Cloud_Not(f), g );
    if ( t1 == NULL )
        return NULL;
    r  = Cloud_bddOr( dd, t0, t1 );
    return r;
}